

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_status_t linear_hash_delete(ion_byte_t *key,linear_hash_table_t *linear_hash)

{
  ion_byte_t iVar1;
  int iVar2;
  int iVar3;
  ion_key_size_t iVar4;
  FILE *pFVar5;
  ion_dictionary_compare_t p_Var6;
  ion_byte_t *piVar7;
  ion_byte_t *piVar8;
  undefined8 bucket_loc;
  ion_fpos_t iVar9;
  long record_loc;
  byte bVar10;
  bool bVar11;
  char cVar12;
  int iVar13;
  ion_byte_t *__dest;
  ion_byte_t *__dest_00;
  ion_byte_t *value;
  size_t sVar14;
  ion_byte_t *__s;
  long lVar15;
  ulong uVar16;
  ion_fpos_t bucket_loc_00;
  long lVar17;
  ulong uVar18;
  ion_byte_t aiStack_c0 [16];
  ion_byte_t *local_b0;
  long local_a8;
  undefined1 local_a0 [8];
  linear_hash_bucket_t bucket;
  long local_50;
  ion_fpos_t swap_record_loc;
  long local_40;
  int local_38;
  ion_byte_t local_31 [8];
  ion_byte_t terminal_record_status;
  
  builtin_memcpy(aiStack_c0,"ڸ\x10",4);
  aiStack_c0[4] = '\0';
  aiStack_c0[5] = '\0';
  aiStack_c0[6] = '\0';
  aiStack_c0[7] = '\0';
  local_38 = insert_hash_to_bucket(key,linear_hash);
  if (local_38 < linear_hash->next_split) {
    aiStack_c0[0] = 0xed;
    aiStack_c0[1] = 0xb8;
    aiStack_c0[2] = '\x10';
    aiStack_c0[3] = '\0';
    aiStack_c0[4] = '\0';
    aiStack_c0[5] = '\0';
    aiStack_c0[6] = '\0';
    aiStack_c0[7] = '\0';
    local_38 = hash_to_bucket(key,linear_hash);
  }
  if (local_38 < linear_hash->bucket_map->current_size) {
    bucket_loc_00 = linear_hash->bucket_map->data[local_38];
  }
  else {
    bucket_loc_00 = -1;
  }
  aiStack_c0[0] = '\x1f';
  aiStack_c0[1] = 0xb9;
  aiStack_c0[2] = '\x10';
  aiStack_c0[3] = '\0';
  aiStack_c0[4] = '\0';
  aiStack_c0[5] = '\0';
  aiStack_c0[6] = '\0';
  aiStack_c0[7] = '\0';
  bVar10 = linear_hash_get_bucket(bucket_loc_00,(linear_hash_bucket_t *)local_a0,linear_hash);
  uVar16 = 0;
  if (bVar10 == 0) {
    uVar16 = (long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0;
    __dest = aiStack_c0 + (8 - uVar16);
    uVar18 = (long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0;
    __dest_00 = __dest + -uVar18;
    sVar14 = (long)linear_hash->records_per_bucket * linear_hash->record_total_size;
    __s = __dest_00 + -(sVar14 + 0xf & 0xfffffffffffffff0);
    __s[-8] = 0x85;
    __s[-7] = 0xb9;
    __s[-6] = '\x10';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    memset(__s,0,sVar14);
    swap_record_loc = (long)__s - uVar16;
    value = (ion_byte_t *)(swap_record_loc - uVar18);
    uVar16 = 0;
    local_31[0] = '\0';
    linear_hash->last_cache_idx = 0;
    local_b0 = key;
    do {
      local_a8 = bucket_loc_00 + 0x10;
      bVar11 = true;
      lVar15 = 0;
      do {
        lVar17 = local_a8;
        if (!bVar11) {
          bVar10 = (int)uVar16 == 0;
          goto LAB_0010bbaa;
        }
        pFVar5 = (FILE *)linear_hash->database;
        value[-8] = 0xe9;
        value[-7] = 0xb9;
        value[-6] = '\x10';
        value[-5] = '\0';
        value[-4] = '\0';
        value[-3] = '\0';
        value[-2] = '\0';
        value[-1] = '\0';
        fseek(pFVar5,lVar17,0);
        iVar13 = linear_hash->records_per_bucket;
        sVar14 = linear_hash->record_total_size;
        pFVar5 = (FILE *)linear_hash->database;
        value[-8] = 0xfe;
        value[-7] = 0xb9;
        value[-6] = '\x10';
        value[-5] = '\0';
        value[-4] = '\0';
        value[-3] = '\0';
        value[-2] = '\0';
        value[-1] = '\0';
        fread(__s,sVar14,(long)iVar13,pFVar5);
        local_40 = lVar17;
        for (iVar13 = 0; bucket_loc = bucket._0_8_, iVar13 < (int)local_a0._4_4_;
            iVar13 = iVar13 + 1) {
          iVar2 = (linear_hash->super).record.key_size;
          iVar1 = (__s + lVar15 + 1)[-1];
          bucket.overflow_location = uVar16;
          value[-8] = 'B';
          value[-7] = 0xba;
          value[-6] = '\x10';
          value[-5] = '\0';
          value[-4] = '\0';
          value[-3] = '\0';
          value[-2] = '\0';
          value[-1] = '\0';
          memcpy(__dest,__s + lVar15 + 1,(long)iVar2);
          iVar3 = (linear_hash->super).record.value_size;
          value[-8] = 'V';
          value[-7] = 0xba;
          value[-6] = '\x10';
          value[-5] = '\0';
          value[-4] = '\0';
          value[-3] = '\0';
          value[-2] = '\0';
          value[-1] = '\0';
          memcpy(__dest_00,__s + iVar2 + lVar15 + 1,(long)iVar3);
          piVar8 = local_b0;
          uVar16 = bucket.overflow_location;
          if (iVar1 != '\0') {
            p_Var6 = (linear_hash->super).compare;
            value[-8] = 's';
            value[-7] = 0xba;
            value[-6] = '\x10';
            value[-5] = '\0';
            value[-4] = '\0';
            value[-3] = '\0';
            value[-2] = '\0';
            value[-1] = '\0';
            cVar12 = (*p_Var6)(__dest,piVar8,iVar2);
            uVar16 = bucket.overflow_location;
            if (cVar12 == '\0') {
              iVar2 = linear_hash->last_cache_idx;
              sVar14 = (size_t)(linear_hash->super).record.value_size;
              piVar7 = linear_hash->cache;
              value[-8] = 0x9b;
              value[-7] = 0xba;
              value[-6] = '\x10';
              value[-5] = '\0';
              value[-4] = '\0';
              value[-3] = '\0';
              value[-2] = '\0';
              value[-1] = '\0';
              memcpy(piVar7 + (long)iVar2 * sVar14,__dest_00,sVar14);
              iVar2 = local_38;
              iVar9 = swap_record_loc;
              linear_hash->last_cache_idx = linear_hash->last_cache_idx + 1;
              local_50 = local_40;
              builtin_memcpy(value + -8,"z\x10",4);
              value[-4] = '\0';
              value[-3] = '\0';
              value[-2] = '\0';
              value[-1] = '\0';
              linear_hash_get_bucket_swap_record
                        (iVar2,&local_50,(ion_byte_t *)iVar9,value,local_31,linear_hash);
              do {
                iVar9 = swap_record_loc;
                uVar16 = (ulong)((int)uVar16 + 1);
                iVar4 = (linear_hash->super).record.key_size;
                p_Var6 = (linear_hash->super).compare;
                builtin_memcpy(value + -8,"Ѻ\x10",4);
                value[-4] = '\0';
                value[-3] = '\0';
                value[-2] = '\0';
                value[-1] = '\0';
                cVar12 = (*p_Var6)((ion_key_t)iVar9,piVar8,iVar4);
                lVar17 = local_50;
                if (cVar12 != '\0') break;
                iVar2 = linear_hash->last_cache_idx;
                sVar14 = (size_t)(linear_hash->super).record.value_size;
                piVar7 = linear_hash->cache;
                value[-8] = 0xf5;
                value[-7] = 0xba;
                value[-6] = '\x10';
                value[-5] = '\0';
                value[-4] = '\0';
                value[-3] = '\0';
                value[-2] = '\0';
                value[-1] = '\0';
                memcpy(piVar7 + (long)iVar2 * sVar14,value,sVar14);
                iVar2 = local_38;
                iVar9 = swap_record_loc;
                linear_hash->last_cache_idx = linear_hash->last_cache_idx + 1;
                if (local_40 == lVar17) break;
                value[-8] = '\x18';
                value[-7] = 0xbb;
                value[-6] = '\x10';
                value[-5] = '\0';
                value[-4] = '\0';
                value[-3] = '\0';
                value[-2] = '\0';
                value[-1] = '\0';
                linear_hash_get_bucket_swap_record
                          (iVar2,&local_50,(ion_byte_t *)iVar9,value,local_31,linear_hash);
                lVar17 = local_50;
              } while (local_31[0] != '\0');
              record_loc = local_40;
              iVar9 = swap_record_loc;
              if (local_40 != lVar17) {
                value[-8] = '@';
                value[-7] = 0xbb;
                value[-6] = '\x10';
                value[-5] = '\0';
                value[-4] = '\0';
                value[-3] = '\0';
                value[-2] = '\0';
                value[-1] = '\0';
                linear_hash_write_record(record_loc,(ion_byte_t *)iVar9,value,local_31,linear_hash);
              }
              value[-8] = 'S';
              value[-7] = 0xbb;
              value[-6] = '\x10';
              value[-5] = '\0';
              value[-4] = '\0';
              value[-3] = '\0';
              value[-2] = '\0';
              value[-1] = '\0';
              linear_hash_get_bucket(bucket_loc_00,(linear_hash_bucket_t *)local_a0,linear_hash);
            }
          }
          local_40 = local_40 + linear_hash->record_total_size;
          lVar15 = lVar15 + linear_hash->record_total_size;
        }
        bVar11 = false;
      } while (bucket._0_8_ == -1);
      value[-8] = 0x9a;
      value[-7] = 0xbb;
      value[-6] = '\x10';
      value[-5] = '\0';
      value[-4] = '\0';
      value[-3] = '\0';
      value[-2] = '\0';
      value[-1] = '\0';
      bVar10 = linear_hash_get_bucket(bucket_loc,(linear_hash_bucket_t *)local_a0,linear_hash);
      bucket_loc_00 = bucket_loc;
    } while (bVar10 == 0);
LAB_0010bbaa:
    uVar16 = uVar16 << 0x20;
  }
  return (ion_status_t)(bVar10 | uVar16);
}

Assistant:

ion_status_t
linear_hash_delete(
	ion_byte_t			*key,
	linear_hash_table_t *linear_hash
) {
	/* status for result count */
	ion_status_t status = ION_STATUS_INITIALIZE;
	/* get the index of the bucket to read */
	int bucket_idx		= insert_hash_to_bucket(key, linear_hash);

	if (bucket_idx < linear_hash->next_split) {
		bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* get the bucket where the record would be located */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* create a linear_hash_record with the desired key, value, and status of full*/
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	int i;

	ion_byte_t *records = alloca(linear_hash->record_total_size * linear_hash->records_per_bucket);

	memset(records, 0, linear_hash->record_total_size * linear_hash->records_per_bucket);

	ion_fpos_t	record_offset = 0;
	ion_fpos_t	record_loc;

	/* memory allocated to transfer the terminal records to delete location for swap on delete */
	ion_byte_t	*terminal_record_key	= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*terminal_record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	terminal_record_status	= linear_hash_record_status_empty;

	linear_hash->last_cache_idx = 0;

	ion_boolean_t terminal = boolean_false;

	while (terminal == boolean_false) {
		record_loc = bucket_loc + sizeof(linear_hash_bucket_t);
		fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
		fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);

		for (i = 0; i < bucket.record_count; i++) {
			/* read in record */
			memcpy(&record_status, records + record_offset, sizeof(record_status));
			memcpy(record_key, records + record_offset + sizeof(record_status), linear_hash->super.record.key_size);
			memcpy(record_value, records + record_offset + sizeof(record_status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

			if (record_status != 0) {
				if (linear_hash->super.compare(record_key, key, linear_hash->super.record.key_size) == 0) {
					/* TODO Create wrapper methods and implement proper error propagation */
					/* cache the record being deleted's value */
					memcpy(linear_hash->cache + linear_hash->last_cache_idx * linear_hash->super.record.value_size, record_value, linear_hash->super.record.value_size);
					linear_hash->last_cache_idx++;

					/* store the record_loc in a write back paramter that is used before being overwritten */
					ion_fpos_t swap_record_loc = record_loc;

					/* obtain the swap record */
					linear_hash_get_bucket_swap_record(bucket_idx, &swap_record_loc, terminal_record_key, terminal_record_value, &terminal_record_status, linear_hash);

					/* delete all swap records which are going to be deleted anyways */
					while (linear_hash->super.compare(terminal_record_key, key, linear_hash->super.record.key_size) == 0) {
						memcpy(linear_hash->cache + linear_hash->last_cache_idx * linear_hash->super.record.value_size, terminal_record_value, linear_hash->super.record.value_size);
						linear_hash->last_cache_idx++;

						/* if we are not trying to swap a record with itself */
						if (record_loc == swap_record_loc) {
							/* write the swapped record to record_loc */
							break;
						}

						linear_hash_get_bucket_swap_record(bucket_idx, &swap_record_loc, terminal_record_key, terminal_record_value, &terminal_record_status, linear_hash);

						if (terminal_record_status == linear_hash_record_status_empty) {
							break;
						}

						status.count++;
					}

					/* if we are not trying to swap a record with itself */
					if (record_loc != swap_record_loc) {
						/* write the swapped record to record_loc */
						linear_hash_write_record(record_loc, terminal_record_key, terminal_record_value, &terminal_record_status, linear_hash);
					}

					status.count++;

					if (status.error != err_ok) {
						return status;
					}

					linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);
				}
			}

			record_loc		+= linear_hash->record_total_size;
			record_offset	+= linear_hash->record_total_size;
		}

		if (bucket.overflow_location == linear_hash_end_of_list) {
			terminal = boolean_true;
		}
		else {
			record_offset	= 0;
			bucket_loc		= bucket.overflow_location;
			status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

			if (status.error != err_ok) {
				return status;
			}
		}
	}

	if (status.count == 0) {
		status.error = err_item_not_found;
	}
	else {
		status.error = err_ok;
	}

	return status;
}